

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O3

void __thiscall RVO::RVOSimulator::doStep(RVOSimulator *this)

{
  pointer ppAVar1;
  int iVar2;
  long lVar3;
  
  KdTree::buildAgentTree(this->kdTree_);
  ppAVar1 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->agents_).
                              super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1) >> 3)) {
    lVar3 = 0;
    do {
      Agent::computeNeighbors(ppAVar1[lVar3]);
      Agent::computeNewVelocity
                ((this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar3]);
      lVar3 = lVar3 + 1;
      ppAVar1 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar2 = (int)((ulong)((long)(this->agents_).
                                  super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1) >> 3);
    } while (lVar3 < iVar2);
    if (0 < iVar2) {
      lVar3 = 0;
      do {
        Agent::update(ppAVar1[lVar3]);
        lVar3 = lVar3 + 1;
        ppAVar1 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (lVar3 < (int)((ulong)((long)(this->agents_).
                                           super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppAVar1) >> 3));
    }
  }
  this->globalTime_ = this->timeStep_ + this->globalTime_;
  return;
}

Assistant:

void RVOSimulator::doStep()
	{
		kdTree_->buildAgentTree();

#ifdef _OPENMP
#pragma omp parallel for
#endif
		for (int i = 0; i < static_cast<int>(agents_.size()); ++i) {
			agents_[i]->computeNeighbors();
			agents_[i]->computeNewVelocity();
		}

#ifdef _OPENMP
#pragma omp parallel for
#endif
		for (int i = 0; i < static_cast<int>(agents_.size()); ++i) {
			agents_[i]->update();
		}

		globalTime_ += timeStep_;
	}